

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

SoftmaxLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_softmax(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xaf) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xaf;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    SoftmaxLayerParams::SoftmaxLayerParams(this_00.softmax_);
    (this->layer_).softmax_ = (SoftmaxLayerParams *)this_00;
  }
  return (SoftmaxLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SoftmaxLayerParams* NeuralNetworkLayer::mutable_softmax() {
  if (!has_softmax()) {
    clear_layer();
    set_has_softmax();
    layer_.softmax_ = new ::CoreML::Specification::SoftmaxLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.softmax)
  return layer_.softmax_;
}